

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.h
# Opt level: O0

void __thiscall
btGeneric6DofSpring2Constraint::setAngularUpperLimit
          (btGeneric6DofSpring2Constraint *this,btVector3 *angularUpper)

{
  btVector3 *in_RSI;
  long in_RDI;
  btScalar bVar1;
  int i;
  undefined4 local_14;
  
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    btVector3::operator_cast_to_float_(in_RSI);
    bVar1 = btNormalizeAngle(2.93387e-39);
    *(btScalar *)(in_RDI + (long)local_14 * 0x58 + 0x3e4) = bVar1;
  }
  return;
}

Assistant:

void setAngularUpperLimit(const btVector3& angularUpper)
	{
		for(int i = 0; i < 3; i++)
			m_angularLimits[i].m_hiLimit = btNormalizeAngle(angularUpper[i]);
	}